

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPController.cpp
# Opt level: O0

ssize_t __thiscall
TCPController::recv(TCPController *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint16_t uVar2;
  ssize_t sVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  element_type *this_00;
  ostream *poVar6;
  ssize_t extraout_RAX;
  undefined1 local_78 [8];
  mapped_type conn;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false> local_60 [3];
  uint16_t local_46;
  mapped_type local_44;
  undefined1 local_40 [4];
  int fd;
  shared_lock<std::shared_mutex> lck;
  tcp_t *tcp;
  uint8_t *data;
  NetworkDevice *local_18;
  TCPController *local_10;
  TCPController *this_local;
  
  local_10 = this;
  sVar3 = IPController::recv((IPController *)&tcp,(int)this->ip_ctrl,__buf,__n,__flags);
  if ((tcp != (tcp_t *)0x0) && (local_18 != (NetworkDevice *)0x0)) {
    lck._8_8_ = tcp;
    std::shared_lock<std::shared_mutex>::shared_lock
              ((shared_lock<std::shared_mutex> *)local_40,&this->mutex_);
    local_46 = ntohs(*(uint16_t *)(lck._8_8_ + 2));
    pmVar4 = std::
             unordered_map<unsigned_short,_int,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_int>_>_>
             ::operator[](&this->port_fd_map,&local_46);
    local_44 = *pmVar4;
    local_60[0]._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
         ::find(&this->connections,&local_44);
    conn.super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
         ::end(&this->connections);
    bVar1 = std::__detail::operator!=
                      (local_60,(_Node_iterator_base<std::pair<const_int,_std::shared_ptr<TCPConnection>_>,_false>
                                 *)&conn.
                                    super___shared_ptr<TCPConnection,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount);
    if (bVar1) {
      pmVar5 = std::
               unordered_map<int,_std::shared_ptr<TCPConnection>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<TCPConnection>_>_>_>
               ::operator[](&this->connections,&local_44);
      std::shared_ptr<TCPConnection>::shared_ptr((shared_ptr<TCPConnection> *)local_78,pmVar5);
      std::shared_lock<std::shared_mutex>::unlock((shared_lock<std::shared_mutex> *)local_40);
      this_00 = std::__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<TCPConnection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_78);
      TCPConnection::recv(this_00,(int)tcp,local_18,(ulong)data._4_4_,__flags);
      std::shared_ptr<TCPConnection>::~shared_ptr((shared_ptr<TCPConnection> *)local_78);
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cout,"not found port");
      uVar2 = ntohs(*(uint16_t *)(lck._8_8_ + 2));
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar2);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      TCPConnection::recv(&this->dummy_connection,(int)tcp,local_18,(ulong)data._4_4_,__flags);
    }
    std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)local_40);
    sVar3 = extraout_RAX;
  }
  return sVar3;
}

Assistant:

void TCPController::recv() {
    auto[data, protocol, from_ip, size] = ip_ctrl.recv();
    if (data != nullptr && size != 0) {
        auto *tcp = (tcp_t *) data;
        std::shared_lock lck(mutex_);
        int fd = port_fd_map[ntohs(tcp->dst_port)];
        if (connections.find(fd) != connections.end()) {
            auto conn = connections[fd];
            lck.unlock();
            conn->recv(data, size, from_ip);
        } else {
            std::cout << "not found port" << ntohs(tcp->dst_port) << std::endl;
            dummy_connection.recv(data, size, from_ip);
        }
    }
}